

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2EndElement(void *ctx,xmlChar *name)

{
  xmlDocPtr doc;
  uint uVar1;
  xmlParserCtxtPtr ctxt;
  
  if (ctx != (void *)0x0) {
    if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
        (*(int *)((long)ctx + 0x18) != 0)) &&
       ((doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0 &&
        (doc->intSubset != (_xmlDtd *)0x0)))) {
      uVar1 = xmlValidateOneElement
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),doc,*(xmlNodePtr *)((long)ctx + 0x50));
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar1;
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    nodePop((xmlParserCtxtPtr)ctx);
    return;
  }
  return;
}

Assistant:

void
xmlSAX2EndElement(void *ctx, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return;

#if defined(LIBXML_SAX1_ENABLED) && defined(LIBXML_VALID_ENABLED)
    if (!ctxt->html && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc,
					     ctxt->node);
#endif /* LIBXML_VALID_ENABLED */

#if defined(LIBXML_SAX1_ENABLED) || defined(LIBXML_HTML_ENABLED)
    ctxt->nodemem = -1;

    /*
     * end of parsing of this node.
     */
    nodePop(ctxt);
#endif
}